

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.cpp
# Opt level: O3

size_t __thiscall
stackjit::CodeGenerator::generateCompileCall
          (CodeGenerator *this,Amd64Assembler *assembler,ManagedFunction *function,
          FunctionDefinition *funcToCall)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar6;
  IntRegister local_44;
  IntRegister local_40;
  IntRegister local_3c;
  IntRegister local_38;
  IntRegister local_34;
  IntRegister local_30;
  IntRegister local_2c;
  
  IntRegister::IntRegister(&local_2c,DI);
  Amd64Assembler::moveLong(assembler,local_2c,(int64_t)function);
  IntRegister::IntRegister(&local_30,SI);
  Amd64Assembler::moveInt(assembler,local_30,0);
  pvVar5 = Amd64Assembler::data(assembler);
  puVar1 = (pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  IntRegister::IntRegister(&local_34,DX);
  pvVar5 = Amd64Assembler::data(assembler);
  Amd64Assembler::moveInt
            (assembler,local_34,
             *(int *)&(pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
             *(int *)&(pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start);
  IntRegister::IntRegister(&local_38,CX);
  Amd64Assembler::moveInt(assembler,local_38,0);
  pvVar5 = Amd64Assembler::data(assembler);
  puVar3 = (pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = (pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  IntRegister::IntRegister(&local_3c,R8);
  Amd64Assembler::moveLong(assembler,local_3c,(int64_t)funcToCall);
  IntRegister::IntRegister(&local_40,AX);
  Amd64Assembler::moveLong(assembler,local_40,0x16f13a);
  IntRegister::IntRegister(&local_44,AX);
  Amd64Assembler::call(assembler,local_44);
  pvVar5 = Amd64Assembler::data(assembler);
  pvVar6 = Amd64Assembler::data(assembler);
  *(int *)(puVar3 + (long)((pvVar5->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start + (-4 - (long)puVar4))) =
       *(int *)&(pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
       *(int *)&(pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  return (size_t)(puVar1 + (-4 - (long)puVar2));
}

Assistant:

std::size_t CodeGenerator::generateCompileCall(Amd64Assembler& assembler,
												   ManagedFunction& function,
												   const FunctionDefinition& funcToCall) {
		std::size_t callIndex;
		std::size_t checkEndIndex;

		assembler.moveLong(RegisterCallArguments::Arg0, (PtrValue)&function);  //The current function
		assembler.moveInt(RegisterCallArguments::Arg1, 0); //Offset of the call
		callIndex = assembler.data().size() - sizeof(int);
		assembler.moveInt(RegisterCallArguments::Arg2, (int)assembler.data().size()); //The offset for this check
		assembler.moveInt(RegisterCallArguments::Arg3, 0); //The end of the this check
		checkEndIndex = assembler.data().size() - sizeof(int);
		assembler.moveLong(RegisterCallArguments::Arg4,	(PtrValue)(&funcToCall)); //The function to compile

		assembler.moveLong(Registers::AX, (PtrValue)&Runtime::compileFunction);
		assembler.call(Registers::AX);

		Helpers::setValue(assembler.data(), checkEndIndex, (int)assembler.data().size());
		return callIndex;
	}